

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ActivationParametricSoftplus::SharedCtor(ActivationParametricSoftplus *this)

{
  this->alpha_ = (WeightParams *)0x0;
  this->beta_ = (WeightParams *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ActivationParametricSoftplus::SharedCtor() {
  ::memset(&alpha_, 0, reinterpret_cast<char*>(&beta_) -
    reinterpret_cast<char*>(&alpha_) + sizeof(beta_));
  _cached_size_ = 0;
}